

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.cpp
# Opt level: O3

real __thiscall sdf_tools::sdf::SdfBox::at(SdfBox *this,real3 r)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  float fVar10;
  
  fVar5 = r.y;
  fVar9 = r.x - (this->center_).x;
  fVar10 = (this->halfExtents_).x;
  fVar8 = fVar9 - fVar10;
  fVar10 = -fVar9 - fVar10;
  if (fVar10 <= fVar8) {
    fVar10 = fVar8;
  }
  uVar1 = (this->center_).y;
  uVar3 = (this->center_).z;
  fVar8 = r.z - (float)uVar3;
  uVar2 = (this->halfExtents_).y;
  uVar4 = (this->halfExtents_).z;
  auVar6._0_4_ = -(fVar5 - (float)uVar1) - (float)uVar2;
  auVar6._4_4_ = -fVar8 - (float)uVar4;
  auVar6._8_4_ = -(fVar5 - 0.0) - 0.0;
  auVar6._12_4_ = -(fVar5 - 0.0) - 0.0;
  auVar7._4_4_ = fVar8 - (float)uVar4;
  auVar7._0_4_ = (fVar5 - (float)uVar1) - (float)uVar2;
  auVar7._8_4_ = (fVar5 - 0.0) - 0.0;
  auVar7._12_4_ = (fVar5 - 0.0) - 0.0;
  auVar7 = maxps(auVar6,auVar7);
  fVar5 = auVar7._4_4_;
  if (auVar7._4_4_ <= auVar7._0_4_) {
    fVar5 = auVar7._0_4_;
  }
  if (fVar5 <= fVar10) {
    fVar5 = fVar10;
  }
  return fVar5 * (float)this->sign_;
}

Assistant:

real SdfBox::at(real3 r) const
{
    r -= center_;
    real3 d {std::max(r.x - halfExtents_.x, -r.x - halfExtents_.x),
             std::max(r.y - halfExtents_.y, -r.y - halfExtents_.y),
             std::max(r.z - halfExtents_.z, -r.z - halfExtents_.z)};

    return sign_ * std::max(d.x, std::max(d.y, d.z));
}